

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tandem.hpp
# Opt level: O0

vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> * __thiscall
tandem::extract_exact_tandem_repeats<std::__cxx11::string>
          (vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *__return_storage_ptr__,
          tandem *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,
          uint32_t min_period,uint32_t max_period)

{
  ulong uVar1;
  domain_error *this_00;
  uint local_1c;
  uint32_t max_period_local;
  uint32_t min_period_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str_local;
  
  local_1c = (uint)str;
  if (local_1c == 0) {
    local_1c = 1;
  }
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) != 0) || (uVar1 = std::__cxx11::string::size(), uVar1 < local_1c)) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>::vector(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  if (min_period < local_1c) {
    this_00 = (domain_error *)__cxa_allocate_exception(0x10);
    std::domain_error::domain_error
              (this_00,
               "find_maximal_repetitions: given unsatisfiable condition min_period > max_period");
    __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  if (min_period < 4) {
    detail::extract_exact_tandem_repeats_naive<std::__cxx11::string>
              (__return_storage_ptr__,(detail *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)local_1c,
               min_period,max_period);
    return __return_storage_ptr__;
  }
  detail::extract_exact_tandem_repeats_lz<std::__cxx11::string>
            (__return_storage_ptr__,(detail *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)local_1c,
             min_period,max_period);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Repeat>
extract_exact_tandem_repeats(const T& str,
                             std::uint32_t min_period = 1,
                             const std::uint32_t max_period = std::numeric_limits<std::uint32_t>::max())
{
    if (min_period == 0) ++min_period;
    if (str.empty() || str.size() < min_period) return {};
    if (min_period > max_period) {
        throw std::domain_error {"find_maximal_repetitions: given unsatisfiable condition min_period > max_period"};
    }
    if (max_period <= 3) { // The naive algorithm is faster in these cases
        return detail::extract_exact_tandem_repeats_naive(str, min_period, max_period);
    } else {
        return detail::extract_exact_tandem_repeats_lz(str, min_period, max_period);
    }
}